

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O0

void __thiscall BoolLinearLE<0>::wakeup(BoolLinearLE<0> *this,int i,int param_3)

{
  uint uVar1;
  int in_ESI;
  Propagator *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  uVar1 = vec<BoolView>::size((vec<BoolView> *)(in_RDI + 1));
  if (in_ESI < (int)uVar1) {
    Tint::operator++((Tint *)in_RDI,in_stack_ffffffffffffffdc);
  }
  Propagator::pushInQueue(in_RDI);
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < static_cast<int>(x.size())) {
			ones++;
		}
		pushInQueue();
	}